

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_format.cpp
# Opt level: O1

bool FormatImage(string *path,Range range)

{
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  bool bVar3;
  int def_cyls;
  int def_heads;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  shared_ptr<Disk> disk;
  Range range_local;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  Format fmt;
  string local_70;
  string local_50;
  
  range_local._8_8_ = range._8_8_;
  range_local._0_8_ = range._0_8_;
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Disk **)&disk,
             (allocator<Disk> *)&fmt);
  bVar3 = ReadImage(path,&disk,true);
  if (bVar3) {
    def_cyls = Disk::cyls(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    def_heads = Disk::heads(disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ValidateRange(&range_local,0x80,2,1,def_cyls,def_heads);
    Format::Format(&fmt,(uint)(opt.cpm != 0));
    fmt.gap3 = 0;
    if (opt.encoding == FM) {
      fmt.sectors = fmt.sectors / 2;
    }
    Format::Override(&fmt,true);
    Format::Validate(&fmt);
    to_string_abi_cxx11_(&local_50,&fmt.datarate);
    _Var2._M_p = local_50._M_dataplus._M_p;
    to_string_abi_cxx11_(&local_70,&fmt.encoding);
    _Var1._M_p = local_70._M_dataplus._M_p;
    uVar4 = Range::cyls(&range_local);
    uVar5 = Range::heads(&range_local);
    uVar7 = (ulong)(uint)fmt.sectors;
    uVar6 = Format::sector_size(&fmt);
    util::fmt_abi_cxx11_
              ((string *)&local_d8,
               "%s %s, %2u cyls, %u heads, %2u sectors/track, %4u bytes/sector\n",_Var2._M_p,
               _Var1._M_p,(ulong)uVar4,(ulong)uVar5,uVar7,(ulong)uVar6);
    util::operator<<((LogHelper *)&util::cout,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8)
    ;
    if ((Format *)local_d8._M_unused._0_8_ != (Format *)&local_c8) {
      operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_d8._M_unused._M_object = &fmt;
    pcStack_c0 = std::
                 _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:69:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/cmd_format.cpp:69:16)>
               ::_M_manager;
    local_d8._8_8_ = &disk;
    Range::each(&range_local,(function<void_(const_CylHead_&)> *)&local_d8,fmt.cyls_first);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
    bVar3 = WriteImage(path,&disk);
  }
  else {
    bVar3 = false;
  }
  if (disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return bVar3;
}

Assistant:

bool FormatImage(const std::string& path, Range range)
{
    auto disk = std::make_shared<Disk>();
    if (!ReadImage(path, disk))
        return false;

    ValidateRange(range, MAX_TRACKS, MAX_SIDES, 1, disk->cyls(), disk->heads());

    // Start with MGT or ProDos format, but with automatic gap3.
    Format fmt{ !opt.cpm ? RegularFormat::MGT : RegularFormat::ProDos };
    fmt.gap3 = 0;

    // Halve the default sector count in FM to ensure it fits.
    if (opt.encoding == Encoding::FM)
        fmt.sectors /= 2;

    // Allow everything to be overridden, but check it's sensible.
    fmt.Override(true);
    fmt.Validate();

    util::cout <<
        util::fmt("%s %s, %2u cyls, %u heads, %2u sectors/track, %4u bytes/sector\n",
            to_string(fmt.datarate).c_str(), to_string(fmt.encoding).c_str(),
            range.cyls(), range.heads(), fmt.sectors, fmt.sector_size());

    range.each([&](const CylHead& cylhead) {
        Track track;
        track.format(cylhead, fmt);
        Message(msgStatus, "Formatting %s", CH(cylhead.cyl, cylhead.head));
        disk->write(cylhead, std::move(track));
        }, fmt.cyls_first);

    return WriteImage(path, disk);
}